

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa embree::MirrorMaterial__sample
                 (ISPCMirrorMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg
                 ,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Vec3fa VVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  
  VVar3 = reflect((Vec3fa *)dg,&wi_o[2].v);
  *(undefined8 *)&(medium->transmission).field_0 = local_38;
  *(undefined8 *)((long)&(medium->transmission).field_0 + 8) = uStack_30;
  medium->eta = 1.0;
  uVar1 = *(undefined8 *)&(brdf->Ka).field_0;
  uVar2 = *(undefined8 *)((long)&(brdf->Ka).field_0 + 8);
  (This->base).type = (int)uVar1;
  (This->base).align[0] = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)((This->base).align + 1) = uVar2;
  VVar3.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar3.field_0;
}

Assistant:

Vec3fa MirrorMaterial__sample(ISPCMirrorMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance);
}